

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

Aig_Man_t * Saig_ManDupIsoCanonical(Aig_Man_t *pAig,int fVerbose)

{
  Aig_Man_t *pAig_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int local_3c;
  int Entry;
  int i;
  Vec_Int_t *vPermCo;
  Vec_Int_t *vPerm;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *pAStack_10;
  int fVerbose_local;
  Aig_Man_t *pAig_local;
  
  pNew._4_4_ = fVerbose;
  pAStack_10 = pAig;
  vPermCo = Saig_ManFindIsoPerm(pAig,fVerbose);
  _Entry = Saig_ManFindIsoPermCos(pAStack_10,vPermCo);
  iVar1 = Aig_ManNodeNum(pAStack_10);
  pObj = (Aig_Obj_t *)Aig_ManStart(iVar1);
  pAVar2 = (Aig_Obj_t *)Abc_UtilStrsav(pAStack_10->pName);
  (pObj->field_0).pNext = pAVar2;
  Aig_ManIncrementTravId(pAStack_10);
  vPerm = (Vec_Int_t *)Aig_ManConst1(pAStack_10);
  pAVar2 = Aig_ManConst1((Aig_Man_t *)pObj);
  vPerm[2].pArray = (int *)pAVar2;
  Aig_ObjSetTravIdCurrent(pAStack_10,(Aig_Obj_t *)vPerm);
  for (local_3c = 0; iVar1 = Vec_IntSize(vPermCo), local_3c < iVar1; local_3c = local_3c + 1) {
    iVar1 = Vec_IntEntry(vPermCo,local_3c);
    vPerm = (Vec_Int_t *)Aig_ManCi(pAStack_10,iVar1);
    pAVar2 = Aig_ObjCreateCi((Aig_Man_t *)pObj);
    vPerm[2].pArray = (int *)pAVar2;
    Aig_ObjSetTravIdCurrent(pAStack_10,(Aig_Obj_t *)vPerm);
  }
  for (local_3c = 0; iVar1 = Vec_IntSize(_Entry), local_3c < iVar1; local_3c = local_3c + 1) {
    iVar1 = Vec_IntEntry(_Entry,local_3c);
    vPerm = (Vec_Int_t *)Aig_ManCo(pAStack_10,iVar1);
    pAig_00 = pAStack_10;
    pAVar2 = pObj;
    pAVar3 = Aig_ObjFanin0((Aig_Obj_t *)vPerm);
    Saig_ManDupIsoCanonical_rec((Aig_Man_t *)pAVar2,pAig_00,pAVar3);
  }
  for (local_3c = 0; iVar1 = Vec_IntSize(_Entry), pAVar2 = pObj, local_3c < iVar1;
      local_3c = local_3c + 1) {
    iVar1 = Vec_IntEntry(_Entry,local_3c);
    vPerm = (Vec_Int_t *)Aig_ManCo(pAStack_10,iVar1);
    pAVar2 = pObj;
    pAVar3 = Aig_ObjChild0Copy((Aig_Obj_t *)vPerm);
    Aig_ObjCreateCo((Aig_Man_t *)pAVar2,pAVar3);
  }
  iVar1 = Aig_ManRegNum(pAStack_10);
  Aig_ManSetRegNum((Aig_Man_t *)pAVar2,iVar1);
  Vec_IntFreeP(&vPermCo);
  Vec_IntFreeP((Vec_Int_t **)&Entry);
  return (Aig_Man_t *)pObj;
}

Assistant:

Aig_Man_t * Saig_ManDupIsoCanonical( Aig_Man_t * pAig, int fVerbose )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    Vec_Int_t * vPerm, * vPermCo;
    int i, Entry;
    // derive permutations
    vPerm   = Saig_ManFindIsoPerm( pAig, fVerbose );
    vPermCo = Saig_ManFindIsoPermCos( pAig, vPerm );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pNew->pName = Abc_UtilStrsav( pAig->pName );
    Aig_ManIncrementTravId( pAig );
    // create constant
    pObj = Aig_ManConst1(pAig);
    pObj->pData = Aig_ManConst1(pNew);
    Aig_ObjSetTravIdCurrent( pAig, pObj );
    // create PIs
    Vec_IntForEachEntry( vPerm, Entry, i )
    {
        pObj = Aig_ManCi(pAig, Entry);
        pObj->pData = Aig_ObjCreateCi(pNew);
        Aig_ObjSetTravIdCurrent( pAig, pObj );
    }
    // traverse from the POs
    Vec_IntForEachEntry( vPermCo, Entry, i )
    {
        pObj = Aig_ManCo(pAig, Entry);
        Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
    }
    // create POs
    Vec_IntForEachEntry( vPermCo, Entry, i )
    {
        pObj = Aig_ManCo(pAig, Entry);
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pAig) );
    Vec_IntFreeP( &vPerm );
    Vec_IntFreeP( &vPermCo );
    return pNew;
}